

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

double __thiscall
soplex::SSVectorBase<double>::operator*(SSVectorBase<double> *this,SSVectorBase<double> *w)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  setup(this);
  lVar9 = (long)(this->super_IdxSet).num;
  lVar4 = (long)(w->super_IdxSet).num;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar13 = dVar11;
  if (0 < lVar4 && 0 < lVar9) {
    piVar1 = (this->super_IdxSet).idx;
    iVar6 = piVar1[lVar9 + -1];
    uVar10 = lVar9 - 1;
    piVar2 = (w->super_IdxSet).idx;
    iVar7 = piVar2[lVar4 + -1];
    uVar5 = lVar4 - 1;
    iVar3 = (int)uVar5;
    iVar8 = (int)uVar10;
    if ((iVar8 != 0) && (iVar3 != 0)) {
      do {
        iVar8 = (int)uVar10;
        iVar3 = (int)uVar5;
        if (iVar6 == iVar7) {
          dVar13 = (this->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar6] *
                   (w->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar7];
          dVar14 = dVar11 + dVar13;
          dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)));
          uVar10 = (ulong)(iVar8 - 1);
          iVar6 = piVar1[(long)iVar8 + -1];
          uVar5 = (ulong)(iVar3 - 1);
          iVar7 = piVar2[(long)iVar3 + -1];
          dVar11 = dVar14;
        }
        else if (iVar7 < iVar6) {
          uVar10 = (ulong)(iVar8 - 1);
          iVar6 = piVar1[(long)iVar8 + -1];
        }
        else {
          uVar5 = (ulong)(iVar3 - 1);
          iVar7 = piVar2[(long)iVar3 + -1];
        }
        iVar3 = (int)uVar5;
        iVar8 = (int)uVar10;
      } while ((iVar8 != 0) && (iVar3 != 0));
    }
    if ((iVar8 != 0) && (iVar6 != iVar7)) {
      lVar4 = (long)iVar8;
      do {
        lVar4 = lVar4 + -1;
        iVar6 = piVar1[lVar4];
        if (lVar4 == 0) break;
      } while (iVar6 != iVar7);
    }
    if ((iVar3 != 0) && (iVar6 != iVar7)) {
      lVar4 = (long)iVar3;
      do {
        lVar4 = lVar4 + -1;
        iVar7 = piVar2[lVar4];
        if (lVar4 == 0) break;
      } while (iVar6 != iVar7);
    }
    dVar13 = dVar11;
    if (iVar6 == iVar7) {
      dVar14 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar6] *
               (w->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar7];
      dVar13 = dVar11 + dVar14;
      dVar12 = dVar12 + (dVar14 - (dVar13 - dVar11)) + (dVar11 - (dVar13 - (dVar13 - dVar11)));
    }
  }
  return dVar13 + dVar12;
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }